

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  MessageBuilderLiteGenerator builderGenerator;
  undefined1 local_58 [64];
  
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_58,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print(printer,
                     "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n\n"
                     ,"classname",(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            ((MessageBuilderLiteGenerator *)local_58,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderLiteGenerator::Generate((MessageBuilderLiteGenerator *)local_58,printer);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator((MessageBuilderLiteGenerator *)local_58)
  ;
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
    "public static Builder newBuilder() {\n"
    "  return DEFAULT_INSTANCE.toBuilder();\n"
    "}\n"
    "public static Builder newBuilder($classname$ prototype) {\n"
    "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}